

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_estimateCCtxSize_usingCCtxParams(ZSTD_CCtx_params *params)

{
  ldmParams_t params_00;
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  undefined8 in_stack_ffffffffffffff20;
  ulong local_c8;
  size_t cctxSpace;
  size_t neededSpace;
  size_t ldmSeqSpace;
  size_t ldmSpace;
  size_t matchStateSize;
  size_t blockStateSpace;
  size_t entropySpace;
  size_t tokenSpace;
  size_t maxNbSeq;
  U32 divider;
  size_t blockSize;
  ZSTD_compressionParameters cParams;
  ZSTD_CCtx_params *params_local;
  
  if (params->nbWorkers < 1) {
    cParams._20_8_ = params;
    ZSTD_getCParamsFromCCtxParams
              ((ZSTD_compressionParameters *)((long)&blockSize + 4),params,0xffffffffffffffff,0);
    if ((ulong)(1L << (blockSize._4_1_ & 0x3f)) < 0x20001) {
      local_c8 = 1L << (blockSize._4_1_ & 0x3f);
    }
    else {
      local_c8 = 0x20000;
    }
    uVar1 = 4;
    if (cParams.hashLog == 3) {
      uVar1 = 3;
    }
    sVar2 = ZSTD_cwksp_alloc_size(local_c8 + 0x20);
    sVar3 = ZSTD_cwksp_alloc_size(local_c8 / uVar1 << 3);
    sVar4 = ZSTD_cwksp_alloc_size(local_c8 / uVar1);
    sVar5 = ZSTD_cwksp_alloc_size(0x1800);
    sVar6 = ZSTD_cwksp_alloc_size(0x11f0);
    sVar7 = ZSTD_sizeof_matchState((ZSTD_compressionParameters *)((long)&blockSize + 4),1);
    params_00.hashRateLog = (int)in_stack_ffffffffffffff20;
    params_00.windowLog = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
    params_00._0_16_ = *(undefined1 (*) [16])(cParams._20_8_ + 0x68);
    sVar8 = ZSTD_ldm_getTableSize(params_00);
    sVar9 = ZSTD_ldm_getMaxNbSeq(*(ldmParams_t *)(cParams._20_8_ + 0x60),local_c8);
    sVar9 = ZSTD_cwksp_alloc_size(sVar9 * 0xc);
    sVar10 = ZSTD_cwksp_alloc_size(0x488);
    params_local = (ZSTD_CCtx_params *)
                   (sVar10 + sVar5 + sVar6 * 2 + sVar2 + sVar3 + sVar4 * 3 + sVar7 + sVar8 + sVar9);
  }
  else {
    params_local = (ZSTD_CCtx_params *)0xffffffffffffffff;
  }
  return (size_t)params_local;
}

Assistant:

size_t ZSTD_estimateCCtxSize_usingCCtxParams(const ZSTD_CCtx_params* params)
{
    RETURN_ERROR_IF(params->nbWorkers > 0, GENERIC, "Estimate CCtx size is supported for single-threaded compression only.");
    {   ZSTD_compressionParameters const cParams =
                ZSTD_getCParamsFromCCtxParams(params, ZSTD_CONTENTSIZE_UNKNOWN, 0);
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, (size_t)1 << cParams.windowLog);
        U32    const divider = (cParams.minMatch==3) ? 3 : 4;
        size_t const maxNbSeq = blockSize / divider;
        size_t const tokenSpace = ZSTD_cwksp_alloc_size(WILDCOPY_OVERLENGTH + blockSize)
                                + ZSTD_cwksp_alloc_size(maxNbSeq * sizeof(seqDef))
                                + 3 * ZSTD_cwksp_alloc_size(maxNbSeq * sizeof(BYTE));
        size_t const entropySpace = ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE);
        size_t const blockStateSpace = 2 * ZSTD_cwksp_alloc_size(sizeof(ZSTD_compressedBlockState_t));
        size_t const matchStateSize = ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 1);

        size_t const ldmSpace = ZSTD_ldm_getTableSize(params->ldmParams);
        size_t const ldmSeqSpace = ZSTD_cwksp_alloc_size(ZSTD_ldm_getMaxNbSeq(params->ldmParams, blockSize) * sizeof(rawSeq));

        size_t const neededSpace = entropySpace + blockStateSpace + tokenSpace +
                                   matchStateSize + ldmSpace + ldmSeqSpace;
        size_t const cctxSpace = ZSTD_cwksp_alloc_size(sizeof(ZSTD_CCtx));

        DEBUGLOG(5, "sizeof(ZSTD_CCtx) : %u", (U32)cctxSpace);
        DEBUGLOG(5, "estimate workspace : %u", (U32)neededSpace);
        return cctxSpace + neededSpace;
    }
}